

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  string *local_60;
  ulong local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_60 = replaceThis;
  local_58 = std::__cxx11::string::find((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,0);
  if (local_58 != 0xffffffffffffffff) {
    uVar6 = local_58;
    do {
      std::__cxx11::string::substr((ulong)local_c0,(ulong)str);
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_c0,(ulong)(withThis->_M_dataplus)._M_p);
      puVar5 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar5) {
        local_90 = *puVar5;
        lStack_88 = plVar2[3];
        local_a0 = &local_90;
      }
      else {
        local_90 = *puVar5;
        local_a0 = (ulong *)*plVar2;
      }
      local_98 = plVar2[1];
      *plVar2 = (long)puVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_80,(ulong)str);
      uVar4 = 0xf;
      if (local_a0 != &local_90) {
        uVar4 = local_90;
      }
      if (uVar4 < (ulong)(local_78 + local_98)) {
        uVar4 = 0xf;
        if (local_80 != local_70) {
          uVar4 = local_70[0];
        }
        if (uVar4 < (ulong)(local_78 + local_98)) goto LAB_00133580;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
      }
      else {
LAB_00133580:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
      }
      local_50 = &local_40;
      puVar1 = puVar3 + 2;
      if ((undefined8 *)*puVar3 == puVar1) {
        local_40 = *puVar1;
        uStack_38 = puVar3[3];
      }
      else {
        local_40 = *puVar1;
        local_50 = (undefined8 *)*puVar3;
      }
      local_48 = puVar3[1];
      *puVar3 = puVar1;
      puVar3[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=((string *)str,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      if (local_a0 != &local_90) {
        operator_delete(local_a0);
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0]);
      }
      uVar4 = 0xffffffffffffffff;
      if (uVar6 < str->_M_string_length - withThis->_M_string_length) {
        uVar4 = std::__cxx11::string::find
                          ((char *)str,(ulong)(local_60->_M_dataplus)._M_p,
                           withThis->_M_string_length + uVar6);
      }
      uVar6 = uVar4;
    } while (uVar4 != 0xffffffffffffffff);
  }
  return local_58 != 0xffffffffffffffff;
}

Assistant:

bool replaceInPlace(std::string& str, std::string const& replaceThis, std::string const& withThis) {
		bool replaced = false;
		std::size_t i = str.find(replaceThis);
		while (i != std::string::npos) {
			replaced = true;
			str = str.substr(0, i) + withThis + str.substr(i + replaceThis.size());
			if (i < str.size() - withThis.size())
				i = str.find(replaceThis, i + withThis.size());
			else
				i = std::string::npos;
		}
		return replaced;
	}